

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_SizeTest_Test::TestBody(ConfidentialTransaction_SizeTest_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  Amount AVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  ConfidentialTransaction tx;
  ConfidentialTransaction empty_tx;
  string local_100;
  Amount local_e0;
  AssertHelper local_d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  ConfidentialAssetId local_b8;
  ConfidentialTransaction local_90;
  ConfidentialTransaction local_50;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_50,2,0);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&local_90);
  cfd::core::ConfidentialTransaction::operator=(&local_90,&local_50);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_b8,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_100,"\"0200000000000000000000\"","tx.GetHex().c_str()",
             "0200000000000000000000",(char *)local_b8._vptr_ConfidentialAssetId);
  ppuVar1 = (pointer *)
            ((long)&local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (local_b8._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_b8._vptr_ConfidentialAssetId);
  }
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xe3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_b8._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*local_b8._vptr_ConfidentialAssetId + 8))();
      }
      local_b8._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100._M_dataplus._M_p._0_4_ = 0xb;
  uVar3 = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"11","tx.GetTotalSize()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xe4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_100._M_dataplus._M_p._0_4_ = 0xb;
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"11","tx.GetVsize()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xe5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_100._M_dataplus._M_p._0_4_ = 0x2c;
  uVar3 = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"44","tx.GetWeight()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xe6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTransaction::AddTxIn
            (&local_90,&exp_txid,2,0xfffffffe,(Script *)cfd::core::Script::Empty);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_b8,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_100,
             "\"020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000\""
             ,"tx.GetHex().c_str()",
             "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000"
             ,(char *)local_b8._vptr_ConfidentialAssetId);
  if (local_b8._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_b8._vptr_ConfidentialAssetId);
  }
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_b8._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*local_b8._vptr_ConfidentialAssetId + 8))();
      }
      local_b8._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100._M_dataplus._M_p._0_4_ = 0x34;
  uVar3 = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"52","tx.GetTotalSize()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xea,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_100._M_dataplus._M_p._0_4_ = 0x34;
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"52","tx.GetVsize()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xeb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_100._M_dataplus._M_p._0_4_ = 0xd0;
  uVar3 = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  local_e0.amount_ = CONCAT44(local_e0.amount_._4_4_,uVar3);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_b8,"208","tx.GetWeight()",(int *)&local_100,(uint *)&local_e0);
  if ((char)local_b8._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xec,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTransaction::operator=(&local_90,&local_50);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_e0.amount_ = AVar5.amount_;
  local_e0.ignore_check_ = AVar5.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_b8,&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTransaction::AddTxOut(&local_90,&local_e0,&local_b8,&exp_locking_script);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_100,&local_90.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c8,
             "\"0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000\""
             ,"tx.GetHex().c_str()",
             "0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000"
             ,local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_c8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      local_100._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ptr_._0_4_ = 0x50;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetTotalSize(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_100,"80","tx.GetTotalSize()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ptr_._0_4_ = 0x50;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetVsize(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_100,"80","tx.GetVsize()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.ptr_._0_4_ = 0x140;
  local_d0.data_._0_4_ = cfd::core::ConfidentialTransaction::GetWeight(&local_90);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_100,"320","tx.GetWeight()",(int *)&local_c8,(uint *)&local_d0);
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_90);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SizeTest) {
  ConfidentialTransaction empty_tx(2, 0);
  ConfidentialTransaction tx;
  tx = empty_tx;
  EXPECT_STREQ("0200000000000000000000", tx.GetHex().c_str());
  EXPECT_EQ(11, tx.GetTotalSize());
  EXPECT_EQ(11, tx.GetVsize());
  EXPECT_EQ(44, tx.GetWeight());

  tx.AddTxIn(exp_txid, exp_index, exp_sequence);
  EXPECT_STREQ("020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000", tx.GetHex().c_str());
  EXPECT_EQ(52, tx.GetTotalSize());
  EXPECT_EQ(52, tx.GetVsize());
  EXPECT_EQ(208, tx.GetWeight());

  tx = empty_tx;
  int64_t exp_satoshi = 12345678;
  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  tx.AddTxOut(amt, asset, exp_locking_script);
  EXPECT_STREQ("0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000", tx.GetHex().c_str());
  EXPECT_EQ(80, tx.GetTotalSize());
  EXPECT_EQ(80, tx.GetVsize());
  EXPECT_EQ(320, tx.GetWeight());
}